

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearTests.cpp
# Opt level: O1

int __thiscall deqp::egl::ColorClearTests::init(ColorClearTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *eglTestCtx;
  TestNode *pTVar1;
  TestNode *node;
  TestNode *node_00;
  ColorClearGroupSpec *pCVar2;
  pointer filters;
  FilterList local_78;
  vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> filterLists;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_context","Single-context color clears");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  createColorClearGroups<deqp::egl::SingleThreadColorClearCase>
            ((this->super_TestCaseGroup).m_eglTestCtx,(TestCaseGroup *)pTVar1,
             init::singleContextCases,init::multiContextCases);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "multi_context","Multi-context color clears with shared surface");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pCVar2 = init::multiContextCases;
  createColorClearGroups<deqp::egl::SingleThreadColorClearCase>
            ((this->super_TestCaseGroup).m_eglTestCtx,(TestCaseGroup *)pTVar1,
             init::multiContextCases,(ColorClearGroupSpec *)&typeinfo);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"multi_thread"
             ,"Multi-thread color clears with shared surface");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  eglTestCtx = (this->super_TestCaseGroup).m_eglTestCtx;
  do {
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,eglTestCtx->m_testCtx,pCVar2->name,pCVar2->desc);
    tcu::TestNode::addChild(pTVar1,node);
    filterLists.
    super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    filterLists.
    super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    filterLists.
    super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.m_rules.
    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    eglu::FilterList::operator<<(&local_78,pCVar2->baseFilter);
    getDefaultRenderFilterLists(&filterLists,&local_78);
    for (filters = filterLists.
                   super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        filters !=
        filterLists.
        super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
        ._M_impl.super__Vector_impl_data._M_finish; filters = filters + 1) {
      node_00 = (TestNode *)operator_new(200);
      MultiThreadColorClearCase::MultiThreadColorClearCase
                ((MultiThreadColorClearCase *)node_00,eglTestCtx,
                 (filters->super_NamedFilterList).m_name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,pCVar2->apiBits,filters->m_surfaceTypeMask
                 ,(FilterList *)filters,pCVar2->numContextsPerApi);
      tcu::TestNode::addChild(node,node_00);
    }
    if (local_78.m_rules.
        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.m_rules.
                      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.m_rules.
                            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.m_rules.
                            super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::~vector
              (&filterLists);
    pCVar2 = pCVar2 + 1;
  } while (pCVar2 != (ColorClearGroupSpec *)&typeinfo);
  return 0x2157da0;
}

Assistant:

void ColorClearTests::init (void)
{
#define CASE(NAME, DESC, BITS, NUMCFG) { NAME, DESC, BITS, renderable<BITS>, NUMCFG }

	static const ColorClearGroupSpec singleContextCases[] =
	{
		CASE("gles1",			"Color clears using GLES1",											EGL_OPENGL_ES_BIT,										1),
		CASE("gles2",			"Color clears using GLES2",											EGL_OPENGL_ES2_BIT,										1),
		CASE("gles3",			"Color clears using GLES3",											EGL_OPENGL_ES3_BIT,										1),
		CASE("vg",				"Color clears using OpenVG",										EGL_OPENVG_BIT,											1)
	};

	static const ColorClearGroupSpec multiContextCases[] =
	{
		CASE("gles1",				"Color clears using multiple GLES1 contexts to shared surface",		EGL_OPENGL_ES_BIT,											3),
		CASE("gles2",				"Color clears using multiple GLES2 contexts to shared surface",		EGL_OPENGL_ES2_BIT,											3),
		CASE("gles3",				"Color clears using multiple GLES3 contexts to shared surface",		EGL_OPENGL_ES3_BIT,											3),
		CASE("vg",					"Color clears using multiple OpenVG contexts to shared surface",	EGL_OPENVG_BIT,												3),
		CASE("gles1_gles2",			"Color clears using multiple APIs to shared surface",				EGL_OPENGL_ES_BIT|EGL_OPENGL_ES2_BIT,						1),
		CASE("gles1_gles2_gles3",	"Color clears using multiple APIs to shared surface",				EGL_OPENGL_ES_BIT|EGL_OPENGL_ES2_BIT|EGL_OPENGL_ES3_BIT,	1),
		CASE("gles1_vg",			"Color clears using multiple APIs to shared surface",				EGL_OPENGL_ES_BIT|EGL_OPENVG_BIT,							1),
		CASE("gles2_vg",			"Color clears using multiple APIs to shared surface",				EGL_OPENGL_ES2_BIT|EGL_OPENVG_BIT,							1),
		CASE("gles3_vg",			"Color clears using multiple APIs to shared surface",				EGL_OPENGL_ES3_BIT|EGL_OPENVG_BIT,							1),
		CASE("gles1_gles2_vg",		"Color clears using multiple APIs to shared surface",				EGL_OPENGL_ES_BIT|EGL_OPENGL_ES2_BIT|EGL_OPENVG_BIT,		1)
	};

#undef CASE

	tcu::TestCaseGroup* singleContextGroup = new tcu::TestCaseGroup(m_testCtx, "single_context", "Single-context color clears");
	addChild(singleContextGroup);
	createColorClearGroups<SingleThreadColorClearCase>(m_eglTestCtx, singleContextGroup, &singleContextCases[0], &singleContextCases[DE_LENGTH_OF_ARRAY(singleContextCases)]);

	tcu::TestCaseGroup* multiContextGroup = new tcu::TestCaseGroup(m_testCtx, "multi_context", "Multi-context color clears with shared surface");
	addChild(multiContextGroup);
	createColorClearGroups<SingleThreadColorClearCase>(m_eglTestCtx, multiContextGroup, &multiContextCases[0], &multiContextCases[DE_LENGTH_OF_ARRAY(multiContextCases)]);

	tcu::TestCaseGroup* multiThreadGroup = new tcu::TestCaseGroup(m_testCtx, "multi_thread", "Multi-thread color clears with shared surface");
	addChild(multiThreadGroup);
	createColorClearGroups<MultiThreadColorClearCase>(m_eglTestCtx, multiThreadGroup, &multiContextCases[0], &multiContextCases[DE_LENGTH_OF_ARRAY(multiContextCases)]);
}